

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

ly_set * lys_find_xpath(ly_ctx *ctx,lys_node *node,char *expr,int options)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  ly_set *set_00;
  LY_ERR *pLVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auStack_58 [8];
  lyxp_set set;
  
  if (ctx == (ly_ctx *)0x0 && node == (lys_node *)0x0 || expr == (char *)0x0) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
LAB_00153fc7:
    set_00 = (ly_set *)0x0;
  }
  else {
    if (node == (lys_node *)0x0) {
      node = ly_ctx_get_node(ctx,(lys_node *)0x0,"/ietf-yang-library:modules-state");
      if (node == (lys_node *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        goto LAB_00153fc7;
      }
    }
    set.val._8_8_ = 0;
    set.used = 0;
    set.size = 0;
    set._8_8_ = 0;
    set.val.nodes = (lyxp_set_nodes *)0x0;
    auStack_58 = (undefined1  [8])0x0;
    set.type = LYXP_SET_EMPTY;
    set._4_4_ = 0;
    iVar3 = lyxp_atomize(expr,node,LYXP_NODE_ELEM,(lyxp_set *)auStack_58,(options & 1U) << 5 | 4);
    if (iVar3 == 0) {
      lVar6 = 0xc;
      set_00 = ly_set_new();
      for (uVar5 = 0; uVar5 < (set.val._8_8_ & 0xffffffff); uVar5 = uVar5 + 1) {
        if (*(int *)(set._8_8_ + lVar6) != 0) {
          if (*(int *)(set._8_8_ + lVar6) != 1) {
            __assert_fail("set.val.snodes[i].in_ctx == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                          ,0xf1b,
                          "struct ly_set *lys_find_xpath(struct ly_ctx *, const struct lys_node *, const char *, int)"
                         );
          }
          if (*(int *)(set._8_8_ + -4 + lVar6) == 2) {
            iVar3 = ly_set_add(set_00,*(void **)(set._8_8_ + -0xc + lVar6),1);
            if (iVar3 == -1) {
              ly_set_free(set_00);
              free((void *)set._8_8_);
              goto LAB_00153fc7;
            }
          }
        }
        lVar6 = lVar6 + 0x10;
      }
      free((void *)set._8_8_);
    }
    else {
      lVar6 = -0x10;
      do {
        lVar1 = lVar6 + 0x10;
        if ((set.val._8_8_ & 0xffffffff) << 4 == lVar1) goto LAB_00153f98;
        piVar2 = (int *)(set._8_8_ + 0x1c + lVar6);
        lVar6 = lVar1;
      } while (*piVar2 != 1);
      node = *(lys_node **)(set._8_8_ + lVar1);
LAB_00153f98:
      free((void *)set._8_8_);
      set_00 = (ly_set *)0x0;
      ly_vlog(LYE_SPEC,LY_VLOG_LYS,node,"Resolving XPath expression \"%s\" failed.",expr);
    }
  }
  return set_00;
}

Assistant:

ly_set *
lys_find_xpath(struct ly_ctx *ctx, const struct lys_node *node, const char *expr, int options)
{
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint32_t i;
    int opts;

    if ((!ctx && !node) || !expr) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (!node) {
        node = ly_ctx_get_node(ctx, NULL, "/ietf-yang-library:modules-state");
        if (!node) {
            ly_errno = LY_EINT;
            return NULL;
        }
    }

    memset(&set, 0, sizeof set);

    opts = LYXP_SNODE;
    if (options & LYS_FIND_OUTPUT) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    if (lyxp_atomize(expr, node, LYXP_NODE_ELEM, &set, opts)) {
        /* just find a relevant node to put in path, if it fails, use the original one */
        for (i = 0; i < set.used; ++i) {
            if (set.val.snodes[i].in_ctx == 1) {
                node = set.val.snodes[i].snode;
                break;
            }
        }
        free(set.val.snodes);
        LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Resolving XPath expression \"%s\" failed.", expr);
        return NULL;
    }

    ret_set = ly_set_new();

    for (i = 0; i < set.used; ++i) {
        if (!set.val.snodes[i].in_ctx) {
            continue;
        }
        assert(set.val.snodes[i].in_ctx == 1);

        switch (set.val.snodes[i].type) {
        case LYXP_NODE_ELEM:
            if (ly_set_add(ret_set, set.val.snodes[i].snode, LY_SET_OPT_USEASLIST) == -1) {
                ly_set_free(ret_set);
                free(set.val.snodes);
                return NULL;
            }
            break;
        default:
            /* ignore roots, text and attr should not ever appear */
            break;
        }
    }

    free(set.val.snodes);
    return ret_set;
}